

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

bool __thiscall mpt::layout::reset(layout *this)

{
  int iVar1;
  unique_array<mpt::item<mpt::layout::graph>_> local_20;
  
  if ((this->_parse != (parser *)0x0) &&
     (iVar1 = (*this->_parse->_vptr_parser[2])(), (char)iVar1 == '\0')) {
    return false;
  }
  unique_array<mpt::item<mpt::layout::graph>_>::unique_array(&local_20,-1);
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_>::operator=
            ((reference<mpt::content<mpt::item<mpt::layout::graph>_>_> *)&this->_graphs,
             &local_20._ref);
  reference<mpt::content<mpt::item<mpt::layout::graph>_>_>::~reference(&local_20._ref);
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x11])
            (this,0,0xffffffff);
  (*(this->super_item_group).super_metatype.super_convertable._vptr_convertable[0x10])
            (this,0,0xffffffff);
  return true;
}

Assistant:

bool layout::reset()
{
	if (_parse && !_parse->reset()) {
		return false;
	}
	_graphs = item_array<graph>();
	set_font(0);
	set_alias(0);
	return true;
}